

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
::clear(raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
        *this)

{
  ulong uVar1;
  
  if (this->size_ != 0) {
    uVar1 = this->capacity_;
    if (uVar1 < 0x80) {
      if (uVar1 != 0) {
        this->size_ = 0;
        memset(this->ctrl_,0x80,uVar1 + 0x10);
        this->ctrl_[uVar1] = -1;
        reset_growth_left(this,this->capacity_);
      }
    }
    else {
      destroy_slots(this);
    }
    if (this->size_ != 0) {
      __assert_fail("empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                    ,0x5a2,
                    "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned long, unsigned long>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, unsigned long>>>::clear() [Policy = phmap::priv::FlatHashMapPolicy<unsigned long, unsigned long>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, unsigned long>>]"
                   );
    }
  }
  return;
}

Assistant:

bool empty() const
			{
				return !size();
			}